

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::draw_vertex(Mesh *this,Vertex *v)

{
  DrawStyle *pDVar1;
  
  pDVar1 = get_draw_style(this,&v->super_HalfedgeElement);
  DrawStyle::style_vertex(pDVar1);
  glBegin(0);
  glVertex3d((v->position).x,(v->position).y,(v->position).z);
  glEnd();
  pDVar1 = get_draw_style(this,&v->super_HalfedgeElement);
  DrawStyle::style_reset(pDVar1);
  return;
}

Assistant:

void Mesh::draw_vertex(const Vertex *v) const {
  get_draw_style(v)->style_vertex();
  glBegin(GL_POINTS);
  glVertex3d(v->position.x, v->position.y, v->position.z);
  glEnd();
  get_draw_style(v)->style_reset();
}